

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OS.cpp
# Opt level: O1

void slang::OS::printE(text_style *style,string_view text)

{
  basic_string_view<char,_std::char_traits<char>_> *in_R9;
  format_string<std::basic_string_view<char>_&> fmt;
  string_view text_00;
  char *local_10;
  FILE *local_8;
  
  local_8 = (FILE *)text._M_str;
  local_10 = (char *)text._M_len;
  if (capturingOutput) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&capturedStderr_abi_cxx11_,(char *)local_8,(size_type)local_10);
    return;
  }
  if (showColorsStderr) {
    fmt.str.size_ = (size_t)&local_10;
    fmt.str.data_ = (char *)0x2;
    ::fmt::v11::print<std::basic_string_view<char,std::char_traits<char>>&>
              (_stderr,(FILE *)style,(text_style *)0x4a29ad,fmt,in_R9);
    return;
  }
  text_00.size_ = (size_t)&stderr;
  text_00.data_ = local_10;
  ::fmt::v11::detail::print((detail *)_stderr,local_8,text_00);
  return;
}

Assistant:

void OS::printE(const fmt::text_style& style, std::string_view text) {
    if (capturingOutput)
        capturedStderr += text;
    else if (showColorsStderr)
        fmt::print(stderr, style, "{}"sv, text);
    else
        fmt::detail::print(stderr, fmt::detail::to_string_view(text));
}